

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
mxx::scatter_recv<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,size_t size,int root,comm *comm
          )

{
  allocator_type local_21;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,size,&local_21);
  scatter<int>((int *)0x0,size,
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,root,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatter_recv(size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(size);
    scatter((const T*)nullptr, size, &result[0], root, comm);
    return result;
}